

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _all.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  GREATEST_INIT();
  greatest_parse_options(argc,argv);
  greatest_run_suite(CGTFS_Database,"CGTFS_Database");
  greatest_run_suite(CGTFS_DatabaseStoring,"CGTFS_DatabaseStoring");
  greatest_run_suite(CGTFS_DatabaseFetching,"CGTFS_DatabaseFetching");
  greatest_run_suite(CGTFS_DatabaseUtils,"CGTFS_DatabaseUtils");
  greatest_run_suite(CGTFS_DatabaseAgency,"CGTFS_DatabaseAgency");
  greatest_run_suite(CGTFS_DatabaseCalendarDates,"CGTFS_DatabaseCalendarDates");
  greatest_run_suite(CGTFS_DatabaseCalendarRecords,"CGTFS_DatabaseCalendarRecords");
  greatest_run_suite(CGTFS_DatabaseFareAttributes,"CGTFS_DatabaseFareAttributes");
  greatest_run_suite(CGTFS_DatabaseFareFule,"CGTFS_DatabaseFareFule");
  greatest_run_suite(CGTFS_DatabaseFeedInfo,"CGTFS_DatabaseFeedInfo");
  greatest_run_suite(CGTFS_DatabaseFrequency,"CGTFS_DatabaseFrequency");
  greatest_run_suite(CGTFS_DatabaseLevel,"CGTFS_DatabaseLevel");
  greatest_run_suite(CGTFS_DatabasePathway,"CGTFS_DatabasePathway");
  greatest_run_suite(CGTFS_DatabaseRoute,"CGTFS_DatabaseRoute");
  greatest_run_suite(CGTFS_DatabaseShape,"CGTFS_DatabaseShape");
  greatest_run_suite(CGTFS_DatabaseStopTime,"CGTFS_DatabaseStopTime");
  greatest_run_suite(CGTFS_DatabaseStop,"CGTFS_DatabaseStop");
  greatest_run_suite(CGTFS_DatabaseTransfers,"CGTFS_DatabaseTransfers");
  greatest_run_suite(CGTFS_DatabaseTrip,"CGTFS_DatabaseTrip");
  greatest_run_suite(CGTFS_EnumParsing,"CGTFS_EnumParsing");
  greatest_run_suite(CGTFS_Feed,"CGTFS_Feed");
  greatest_run_suite(CGTFS_Filenames,"CGTFS_Filenames");
  greatest_run_suite(CGTFS_Haversine,"CGTFS_Haversine");
  greatest_run_suite(CGTFS_FileUtils,"CGTFS_FileUtils");
  greatest_run_suite(CGTFS_StrUtils,"CGTFS_StrUtils");
  greatest_run_suite(CGTFS_RecordAgency,"CGTFS_RecordAgency");
  greatest_run_suite(CGTFS_RecordCalendarDate,"CGTFS_RecordCalendarDate");
  greatest_run_suite(CGTFS_RecordCalendarRecord,"CGTFS_RecordCalendarRecord");
  greatest_run_suite(CGTFS_RecordFareAttributes,"CGTFS_RecordFareAttributes");
  greatest_run_suite(CGTFS_RecordFareRule,"CGTFS_RecordFareRule");
  greatest_run_suite(CGTFS_RecordFeedInfo,"CGTFS_RecordFeedInfo");
  greatest_run_suite(CGTFS_RecordFrequency,"CGTFS_RecordFrequency");
  greatest_run_suite(CGTFS_RecordLevel,"CGTFS_RecordLevel");
  greatest_run_suite(CGTFS_RecordPathway,"CGTFS_RecordPathway");
  greatest_run_suite(CGTFS_RecordRoute,"CGTFS_RecordRoute");
  greatest_run_suite(CGTFS_RecordShape,"CGTFS_RecordShape");
  greatest_run_suite(CGTFS_RecordStopTime,"CGTFS_RecordStopTime");
  greatest_run_suite(CGTFS_RecordStop,"CGTFS_RecordStop");
  greatest_run_suite(CGTFS_RecordTransfer,"CGTFS_RecordTransfer");
  greatest_run_suite(CGTFS_RecordTrip,"CGTFS_RecordTrip");
  greatest_run_suite(CGTFS_FileReading,"CGTFS_FileReading");
  GREATEST_PRINT_REPORT();
  iVar1 = greatest_all_passed();
  return (uint)(iVar1 == 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN();

    RUN_SUITE(CGTFS_Database);
    RUN_SUITE(CGTFS_DatabaseStoring);
    RUN_SUITE(CGTFS_DatabaseFetching);  // Run CGTFS_DatabaseStoring first!
    RUN_SUITE(CGTFS_DatabaseUtils);

    RUN_SUITE(CGTFS_DatabaseAgency);
    RUN_SUITE(CGTFS_DatabaseCalendarDates);
    RUN_SUITE(CGTFS_DatabaseCalendarRecords);
    RUN_SUITE(CGTFS_DatabaseFareAttributes);
    RUN_SUITE(CGTFS_DatabaseFareFule);
    RUN_SUITE(CGTFS_DatabaseFeedInfo);
    RUN_SUITE(CGTFS_DatabaseFrequency);
    RUN_SUITE(CGTFS_DatabaseLevel);
    RUN_SUITE(CGTFS_DatabasePathway);
    RUN_SUITE(CGTFS_DatabaseRoute);
    RUN_SUITE(CGTFS_DatabaseShape);
    RUN_SUITE(CGTFS_DatabaseStopTime);
    RUN_SUITE(CGTFS_DatabaseStop);
    RUN_SUITE(CGTFS_DatabaseTransfers);
    RUN_SUITE(CGTFS_DatabaseTrip);

    RUN_SUITE(CGTFS_EnumParsing);
    RUN_SUITE(CGTFS_Feed);
    RUN_SUITE(CGTFS_Filenames);
    RUN_SUITE(CGTFS_Haversine);

    RUN_SUITE(CGTFS_FileUtils);
    RUN_SUITE(CGTFS_StrUtils);

    RUN_SUITE(CGTFS_RecordAgency);
    RUN_SUITE(CGTFS_RecordCalendarDate);
    RUN_SUITE(CGTFS_RecordCalendarRecord);
    RUN_SUITE(CGTFS_RecordFareAttributes);
    RUN_SUITE(CGTFS_RecordFareRule);
    RUN_SUITE(CGTFS_RecordFeedInfo);
    RUN_SUITE(CGTFS_RecordFrequency);
    RUN_SUITE(CGTFS_RecordLevel);
    RUN_SUITE(CGTFS_RecordPathway);
    RUN_SUITE(CGTFS_RecordRoute);
    RUN_SUITE(CGTFS_RecordShape);
    RUN_SUITE(CGTFS_RecordStopTime);
    RUN_SUITE(CGTFS_RecordStop);
    RUN_SUITE(CGTFS_RecordTransfer);
    RUN_SUITE(CGTFS_RecordTrip);

    RUN_SUITE(CGTFS_FileReading);

    GREATEST_MAIN_END();
}